

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::addInput(CoreBroker *this,ActionMessage *message)

{
  string_view key;
  bool bVar1;
  size_t in_RSI;
  CoreBroker *in_RDI;
  __sv_type _Var2;
  InterfaceHandle unaff_retaddr;
  GlobalFederateId unaff_retaddr_00;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  BasicHandleInfo *inp;
  string *in_stack_00000230;
  BasicHandleInfo *in_stack_00000238;
  CoreBroker *in_stack_00000240;
  InterfaceType in_stack_00000387;
  ActionMessage *in_stack_00000388;
  CoreBroker *in_stack_00000390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  ActionMessage *in_stack_ffffffffffffff88;
  BasicHandleInfo *handleInfo;
  ActionMessage *local_48;
  InterfaceType what;
  HandleManager *in_stack_ffffffffffffffe8;
  CoreBroker *pCVar3;
  
  pCVar3 = in_RDI;
  bVar1 = checkInterfaceCreation(in_stack_00000390,in_stack_00000388,in_stack_00000387);
  if (bVar1) {
    handleInfo = (BasicHandleInfo *)&in_RDI->handles;
    what = (InterfaceType)((uint)*(undefined4 *)(in_RSI + 8) >> 0x18);
    ActionMessage::name((ActionMessage *)0x5de42b);
    ActionMessage::getString_abi_cxx11_
              (in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
    ActionMessage::getString_abi_cxx11_
              (in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
    local_48 = (ActionMessage *)_Var2._M_str;
    key._M_str = (char *)pCVar3;
    key._M_len = in_RSI;
    HandleManager::addHandle
              (in_stack_ffffffffffffffe8,unaff_retaddr_00,unaff_retaddr,what,key,
               (string_view)in_stack_00000010,in_stack_00000020);
    addLocalInfo(in_RDI,handleInfo,local_48);
    if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,in_RSI);
    }
    else {
      findAndNotifyInputTargets(in_stack_00000240,in_stack_00000238,in_stack_00000230);
    }
  }
  return;
}

Assistant:

void CoreBroker::addInput(ActionMessage& message)
{
    if (!checkInterfaceCreation(message, InterfaceType::INPUT)) {
        return;
    }
    auto& inp = handles.addHandle(message.source_id,
                                  message.source_handle,
                                  InterfaceType::INPUT,
                                  message.name(),
                                  message.getString(typeStringLoc),
                                  message.getString(unitStringLoc));

    addLocalInfo(inp, message);
    if (!isRootc) {
        transmit(parent_route_id, message);
    } else {
        findAndNotifyInputTargets(inp, inp.key);
    }
}